

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O2

void raviX_ptrlist_sort(PtrList **plist,void *userdata,_func_int_void_ptr_void_ptr_void_ptr *cmp)

{
  PtrList **ppPVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  PtrList *pPVar9;
  int i;
  uint uVar10;
  long lVar11;
  PtrList *pPVar12;
  PtrList *pPVar13;
  PtrList *b;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int local_10c;
  int local_108;
  int local_104;
  _func_int_void_ptr_void_ptr_void_ptr *local_100;
  PtrList *local_f8;
  ulong local_f0;
  PtrList *local_e8;
  ulong local_e0;
  PtrList *local_d8;
  PtrList *local_d0;
  uint local_c4;
  PtrList **local_c0;
  void *local_b8;
  void *local_b0;
  void *buffer [14];
  
  pPVar12 = *plist;
  local_100 = cmp;
  local_d8 = pPVar12;
  local_c0 = plist;
  if (pPVar12 == (PtrList *)0x0) {
    return;
  }
  do {
    local_f0 = (ulong)*(char *)pPVar12;
    lVar14 = 0;
    for (lVar11 = 1; lVar11 < (long)local_f0; lVar11 = lVar11 + 1) {
      pvVar2 = pPVar12->list_[lVar11];
      iVar4 = (*local_100)(userdata,pPVar12->list_[lVar11 + -1],pvVar2);
      lVar3 = lVar14;
      if (0 < iVar4) {
        do {
          lVar6 = lVar3;
          *(undefined8 *)((long)pPVar12->list_ + lVar6 + 8) =
               *(undefined8 *)((long)pPVar12->list_ + lVar6);
          if (lVar6 == 0) break;
          iVar4 = (*local_100)(userdata,*(void **)((long)pPVar12->list_ + lVar6 + -8),pvVar2);
          lVar3 = lVar6 + -8;
        } while (0 < iVar4);
        *(void **)((long)pPVar12->list_ + lVar6) = pvVar2;
      }
      lVar14 = lVar14 + 8;
    }
    uVar10 = 1;
    verify_sorted(pPVar12,1,userdata,local_100);
    pPVar12 = pPVar12->next_;
  } while (pPVar12 != local_d8);
  do {
    uVar15 = ~((int)uVar10 >> 0x1f) & uVar10;
    iVar4 = uVar15 + 1;
    pPVar12 = local_d8;
    local_104 = iVar4;
    local_e0 = (ulong)uVar15;
    pPVar13 = local_d8;
    pPVar9 = local_d8;
    do {
      while (iVar4 = iVar4 + -1, iVar4 == 0) {
        uVar7 = 0;
        local_d8 = pPVar12;
        do {
          if ((int)local_e0 == (int)uVar7) {
            uVar7 = local_e0 & 0xffffffff;
            break;
          }
          local_d8 = local_d8->next_;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (local_d8 != pPVar13);
        local_10c = 0;
        iVar8 = (int)uVar7;
        uVar16 = uVar7;
LAB_0010b98f:
        local_f8 = pPVar9;
        local_c4 = uVar10;
        if (*(char *)pPVar12 == '\0') goto code_r0x0010b996;
        local_f0 = CONCAT44(local_f0._4_4_,iVar8);
        b = pPVar9;
        local_d0 = pPVar13;
        do {
          if ((short)(*(int *)b << 8) != 0) {
            iVar4 = (*local_100)(userdata,b->list_[(long)(short)(char)*(int *)b + -1],
                                 pPVar12->list_[0]);
            uVar7 = local_f0 & 0xffffffff;
            if (-1 < iVar4) {
              iVar4 = 0;
              local_e8 = local_f8;
              do {
                iVar8 = 0;
LAB_0010ba3f:
                do {
                  while( true ) {
                    if ((iVar4 < 0) || (*(char *)b <= iVar4)) {
                      __assert_fail("i1 >= 0 && i1 < b1->nr_",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                                    ,0x200,
                                    "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                                   );
                    }
                    if ((iVar8 < 0) || (*(char *)pPVar12 <= iVar8)) {
                      __assert_fail("i2 >= 0 && i2 < b2->nr_",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                                    ,0x201,
                                    "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                                   );
                    }
                    if (b == pPVar12) {
                      __assert_fail("b1 != b2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                                    ,0x202,
                                    "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                                   );
                    }
                    if ((int)uVar10 < 1) {
                      __assert_fail("n > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                                    ,0x203,
                                    "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                                   );
                    }
                    if ((int)uVar16 < 1) {
                      __assert_fail("m > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                                    ,0x204,
                                    "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                                   );
                    }
                    local_b8 = b->list_[iVar4];
                    local_b0 = pPVar12->list_[iVar8];
                    local_108 = iVar4;
                    iVar5 = (*local_100)(userdata,local_b8,local_b0);
                    iVar4 = local_108;
                    lVar11 = (long)local_10c;
                    local_10c = local_10c + 1;
                    if (0 < iVar5) break;
                    buffer[lVar11] = local_b8;
                    iVar4 = local_108 + 1;
                    if (*(char *)b <= iVar4) {
                      local_108 = iVar8;
                      flush_to(b,buffer,&local_10c);
LAB_0010bb0d:
                      b = b->next_;
                      if (uVar10 != 1) goto code_r0x0010bb1b;
                      for (; b != pPVar12; b = b->next_) {
                        flush_to(b,buffer,&local_10c);
                      }
                      iVar4 = local_108;
                      if (local_10c != local_108) {
                        __assert_fail("nbuf == i2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                                      ,0x216,
                                      "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                                     );
                      }
                      goto LAB_0010bbd0;
                    }
                  }
                  iVar8 = iVar8 + 1;
                  buffer[lVar11] = local_b0;
                } while (iVar8 < *(char *)pPVar12);
                pPVar9 = pPVar12->prev_;
                pPVar13 = pPVar12->next_;
                pPVar13->prev_ = pPVar9;
                pPVar9->next_ = pPVar13;
                pPVar12->next_ = b;
                if (b == local_e8) {
                  local_e8 = pPVar12;
                }
                pPVar12->prev_ = b->prev_;
                b->prev_ = pPVar12;
                pPVar12->prev_->next_ = pPVar12;
                flush_to(pPVar12,buffer,&local_10c);
                pPVar12 = pPVar13->prev_;
                do {
                  uVar15 = (int)uVar16 - 1;
                  uVar16 = (ulong)uVar15;
                  if (uVar15 == 0) {
                    pPVar12 = b;
                    if (local_10c != iVar4) {
                      __assert_fail("nbuf == i1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                                    ,0x23a,
                                    "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                                   );
                    }
LAB_0010bbd0:
                    dump_to(pPVar12,buffer,iVar4);
                    pPVar9 = local_e8;
                    pPVar13 = local_d0;
                    iVar8 = (int)local_f0;
                    goto LAB_0010b9fd;
                  }
                  pPVar12 = pPVar12->next_;
                } while (*(char *)pPVar12 == '\0');
              } while( true );
            }
          }
          iVar8 = (int)uVar7;
          b = b->next_;
          uVar10 = uVar10 - 1;
          pPVar9 = local_f8;
          pPVar13 = local_d0;
        } while (uVar10 != 0);
LAB_0010b9fd:
        uVar10 = local_c4;
        uVar7 = local_e0;
        iVar4 = local_104;
        verify_sorted(pPVar9,iVar8 + local_c4,userdata,local_100);
        if (local_f8 == pPVar13) {
          pPVar13 = pPVar9;
        }
        pPVar12 = local_d8;
        local_e0 = uVar7;
        pPVar9 = local_d8;
        if (local_d8 == pPVar13) goto LAB_0010bc0b;
      }
      ppPVar1 = &pPVar12->next_;
      pPVar12 = *ppPVar1;
    } while (*ppPVar1 != pPVar13);
    if (pPVar9 == pPVar13) {
      *local_c0 = pPVar13;
      return;
    }
LAB_0010bc0b:
    uVar10 = uVar10 * 2;
    local_d8 = pPVar13;
  } while( true );
code_r0x0010b996:
  pPVar12 = pPVar12->next_;
  uVar15 = (int)uVar16 - 1;
  uVar16 = (ulong)uVar15;
  if (uVar15 == 0) goto LAB_0010b9fd;
  goto LAB_0010b98f;
code_r0x0010bb1b:
  uVar10 = uVar10 - 1;
  if (*(char *)b != '\0') goto code_r0x0010bb24;
  goto LAB_0010bb0d;
code_r0x0010bb24:
  iVar4 = 0;
  iVar8 = local_108;
  goto LAB_0010ba3f;
}

Assistant:

void raviX_ptrlist_sort(PtrList **plist, void *userdata, int (*cmp)(void *, const void *, const void *))
{
	PtrList *head = *plist, *list = head;
	int blocks = 1;

	assert(N_ == LIST_NODE_NR);
	if (!head)
		return;

	// Sort all the sub-lists
	do {
		array_sort(list->list_, list->nr_, userdata, cmp);
#ifdef PARANOIA
		verify_sorted(list, 1, userdata, cmp);
#endif
		list = list->next_;
	} while (list != head);

	// Merge the damn things together
	while (1) {
		PtrList *block1 = head;

		do {
			PtrList *block2 = block1;
			PtrList *next, *newhead;
			int i;

			for (i = 0; i < blocks; i++) {
				block2 = block2->next_;
				if (block2 == head) {
					if (block1 == head) {
						// BEEN_THERE('A');
						*plist = head;
						return;
					}
					// BEEN_THERE('B');
					goto next_pass;
				}
			}

			next = block2;
			for (i = 0; i < blocks;) {
				next = next->next_;
				i++;
				if (next == head) {
					// BEEN_THERE('C');
					break;
				}
				// BEEN_THERE('D');
			}

			newhead = merge_block_seqs(block1, blocks, block2, i, userdata, cmp);
#ifdef PARANOIA
			verify_sorted(newhead, blocks + i, userdata, cmp);
#endif
			if (block1 == head) {
				// BEEN_THERE('E');
				head = newhead;
			}
			block1 = next;
		} while (block1 != head);
	next_pass:
		blocks <<= 1;
	}
}